

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

int bitstream_w_write(bitstream_w *stream,uint64_t src,int32_t bits)

{
  void *pvVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint8_t *buffer;
  size_t size;
  size_t offset;
  uint32_t bit_end;
  uint32_t bit_start;
  int32_t bits_local;
  uint64_t src_local;
  bitstream_w *stream_local;
  
  if (bits < 1) {
    stream_local._4_4_ = 0;
  }
  else if (bits < 0x39) {
    pvVar1 = stream->ptr;
    uVar2 = (uint)stream->bit_offset;
    uVar3 = uVar2 + bits;
    uVar4 = (ulong)(uVar2 >> 3);
    buffer = (uint8_t *)((uVar3 + 7 >> 3) - uVar4);
    if ((uint8_t *)stream->length < buffer + uVar4) {
      stream_local._4_4_ = -1;
    }
    else {
      stream->bit_offset = (long)bits + stream->bit_offset;
      _bit_start = (1L << ((byte)bits & 0x3f)) - 1U & src;
      uVar3 = uVar3 & 7;
      if (uVar3 != 0) {
        _bit_start = _bit_start << (8U - (char)uVar3 & 0x3f);
      }
      while (buffer != (uint8_t *)0x0) {
        buffer = buffer + -1;
        buffer[(long)pvVar1 + uVar4] = buffer[(long)pvVar1 + uVar4] | (byte)_bit_start;
        _bit_start = _bit_start >> 8;
      }
      stream_local._4_4_ = 0;
    }
  }
  else {
    stream_local._4_4_ = -1;
  }
  return stream_local._4_4_;
}

Assistant:

int
bitstream_w_write(struct bitstream_w *stream, uint64_t src, int32_t bits) {
  uint32_t bit_start, bit_end;
  size_t offset, size;
  uint8_t *buffer;

  if (bits <= 0) {
    return 0;
  }

  if (bits > 56) {
    return -1;
  }

  buffer = stream->ptr;

  /* copy range */
  bit_start = stream->bit_offset;
  bit_end = bit_start + bits;

  /* calculate offset */
  offset = bit_start / 8;
  size = (bit_end + 7) / 8 - offset;

  /* check range */
  if (offset + size > stream->length) {
    return -1;
  }

  /* advance pointer */
  stream->bit_offset += bits;

  /* mask input */
  src &= ((1ull << bits) - 1ull);

  /* shift source value */
  bit_end = bit_end & 7;
  if (bit_end != 0) {
    src <<= (8 - bit_end);
  }

  /* write data to buffer */
  while (size > 0) {
    size--;

    buffer[offset + size] |= (src & 0xFF);
    src >>= 8;
  }

  return 0;
}